

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O2

ares_status_t ares_uri_set_scheme(ares_uri_t *uri,char *scheme)

{
  size_t sVar1;
  byte bVar2;
  byte *pbVar3;
  
  if (uri == (ares_uri_t *)0x0) {
    return ARES_EFORMERR;
  }
  sVar1 = ares_strlen(scheme);
  if ((sVar1 == 0) || (bVar2 = *scheme, 0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
    return ARES_EBADSTR;
  }
  pbVar3 = (byte *)(scheme + 1);
  do {
    if ((1 < bVar2 - 0x2d) && (bVar2 != 0x2b)) {
      if (bVar2 == 0) {
        ares_strcpy(uri->scheme,scheme,0x10);
        ares_str_lower(uri->scheme);
        return ARES_SUCCESS;
      }
      if (((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) {
        return ARES_EBADSTR;
      }
    }
    bVar2 = *pbVar3;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

ares_status_t ares_uri_set_scheme(ares_uri_t *uri, const char *scheme)
{
  if (uri == NULL) {
    return ARES_EFORMERR;
  }

  if (!ares_uri_scheme_is_valid(scheme)) {
    return ARES_EBADSTR;
  }

  ares_strcpy(uri->scheme, scheme, sizeof(uri->scheme));
  ares_str_lower(uri->scheme);

  return ARES_SUCCESS;
}